

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemSize(ImVec2 *size,float text_offset_y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *g;
  uint uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4->SkipItems == false) {
    fVar1 = (pIVar4->DC).CurrLineSize.y;
    uVar6 = -(uint)(size->y <= fVar1);
    fVar9 = (float)(~uVar6 & (uint)size->y | (uint)fVar1 & uVar6);
    fVar1 = (pIVar4->DC).CurrLineTextBaseOffset;
    uVar6 = -(uint)(text_offset_y <= fVar1);
    fVar8 = (float)(~uVar6 & (uint)text_offset_y | (uint)fVar1 & uVar6);
    fVar1 = (pIVar4->Pos).x;
    fVar7 = (pIVar4->DC).CursorPos.x + size->x;
    (pIVar4->DC).CursorPosPrevLine.x = fVar7;
    fVar2 = (pIVar4->DC).CursorPos.y;
    (pIVar4->DC).CursorPosPrevLine.y = fVar2;
    (pIVar4->DC).CursorPos.x =
         (float)(int)(fVar1 + (pIVar4->DC).Indent.x + (pIVar4->DC).ColumnsOffset.x);
    fVar1 = (pIVar5->Style).ItemSpacing.y;
    fVar10 = (float)(int)(fVar9 + fVar2 + fVar1);
    (pIVar4->DC).CursorPos.y = fVar10;
    fVar3 = (pIVar4->DC).CursorMaxPos.x;
    uVar6 = -(uint)(fVar7 <= fVar3);
    (pIVar4->DC).CursorMaxPos.x = (float)(uVar6 & (uint)fVar3 | ~uVar6 & (uint)fVar7);
    fVar3 = (pIVar4->DC).CursorMaxPos.y;
    fVar10 = fVar10 - fVar1;
    uVar6 = -(uint)(fVar10 <= fVar3);
    (pIVar4->DC).CursorMaxPos.y = (float)(uVar6 & (uint)fVar3 | ~uVar6 & (uint)fVar10);
    (pIVar4->DC).PrevLineSize.y = fVar9;
    (pIVar4->DC).PrevLineTextBaseOffset = fVar8;
    (pIVar4->DC).CurrLineTextBaseOffset = 0.0;
    (pIVar4->DC).CurrLineSize.y = 0.0;
    if ((pIVar4->DC).LayoutType == 0) {
      pIVar4->WriteAccessed = true;
      (pIVar4->DC).CursorPos.x = fVar7 + (pIVar5->Style).ItemSpacing.x;
      (pIVar4->DC).CursorPos.y = fVar2;
      (pIVar4->DC).CurrLineSize = (pIVar4->DC).PrevLineSize;
      (pIVar4->DC).CurrLineTextBaseOffset = fVar8;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_offset_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // Always align ourselves on pixel boundaries
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y);
    const float text_base_offset = ImMax(window->DC.CurrLineTextBaseOffset, text_offset_y);
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = (float)(int)(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.PrevLineTextBaseOffset = text_base_offset;
    window->DC.CurrLineSize.y = window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}